

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O1

sexp_heap_conflict sexp_gc_packed_heap_make(size_t packed_size,size_t free_size)

{
  sexp_free_list_conflict psVar1;
  char *pcVar2;
  sexp_heap_conflict psVar3;
  sexp_uint_t sVar4;
  
  sVar4 = 0x20;
  if (0x1e < free_size - 1) {
    sVar4 = free_size + 0x1f & 0xffffffffffffffe0;
  }
  psVar3 = sexp_make_heap(packed_size + sVar4 + 0xaf & 0xffffffffffffffe0,0,0);
  if (psVar3 == (sexp_heap_conflict)0x0) {
    builtin_strncpy(gc_heap_err_str,"Could not allocate memory for heap",0x23);
    psVar3 = (sexp_heap_conflict)0x0;
  }
  else {
    psVar1 = psVar3->free_list;
    pcVar2 = psVar3->data;
    psVar3->size = sVar4 + packed_size + 0x20;
    psVar1->size = 0;
    if (sVar4 == 0) {
      psVar1->next = (sexp_free_list)0x0;
    }
    else {
      psVar1->next = (sexp_free_list)(pcVar2 + packed_size + 0x20);
      pcVar2 = pcVar2 + packed_size + 0x28;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
      psVar1->next->size = sVar4;
    }
  }
  return psVar3;
}

Assistant:

static sexp_heap sexp_gc_packed_heap_make(size_t packed_size, size_t free_size) {
  if (free_size > 0 && free_size < 2*sexp_free_chunk_size) {
    free_size = 2*sexp_free_chunk_size;
  }
  free_size = sexp_heap_align(free_size);
  size_t req_size = packed_size + free_size + sexp_free_chunk_size + 128;
  sexp_heap heap = sexp_make_heap(sexp_heap_align(req_size), 0, 0);
  if (!heap) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE, "Could not allocate memory for heap");
    return NULL;
  }
  sexp base = sexp_heap_first_block(heap);
  size_t pad = (unsigned char *)base - (unsigned char *)heap->data;
  heap->size = packed_size + free_size + pad;
  heap->free_list->size = 0;
  if (free_size == 0) {
    heap->free_list->next = NULL;
  } else {
    heap->free_list->next = (sexp_free_list)((unsigned char *)base + packed_size);
    heap->free_list->next->next = NULL;
    heap->free_list->next->size = free_size;
  }
  return heap;
}